

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::stencilOpSeparate
          (ReferenceContext *this,deUint32 face,deUint32 sfail,deUint32 dpfail,deUint32 dppass)

{
  bool bVar1;
  
  bVar1 = isValidStencilOp(sfail);
  if (((!bVar1) || (bVar1 = isValidStencilOp(dpfail), !bVar1)) ||
     (bVar1 = isValidStencilOp(dppass), !bVar1)) {
LAB_008178dc:
    if (this->m_lastError == 0) {
      this->m_lastError = 0x500;
    }
    return;
  }
  if (face != 0x404) {
    if (face == 0x405) goto LAB_008178c6;
    if (face != 0x408) goto LAB_008178dc;
  }
  this->m_stencil[0].opStencilFail = sfail;
  this->m_stencil[0].opDepthFail = dpfail;
  this->m_stencil[0].opDepthPass = dppass;
  if ((face != 0x408) && (face != 0x405)) {
    return;
  }
LAB_008178c6:
  this->m_stencil[1].opStencilFail = sfail;
  this->m_stencil[1].opDepthFail = dpfail;
  this->m_stencil[1].opDepthPass = dppass;
  return;
}

Assistant:

void ReferenceContext::stencilOpSeparate (deUint32 face, deUint32 sfail, deUint32 dpfail, deUint32 dppass)
{
	const bool	setFront	= face == GL_FRONT || face == GL_FRONT_AND_BACK;
	const bool	setBack		= face == GL_BACK || face == GL_FRONT_AND_BACK;

	RC_IF_ERROR(!isValidStencilOp(sfail)	||
				!isValidStencilOp(dpfail)	||
				!isValidStencilOp(dppass),
				GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(!setFront && !setBack, GL_INVALID_ENUM, RC_RET_VOID);

	for (int type = 0; type < rr::FACETYPE_LAST; ++type)
	{
		if ((type == rr::FACETYPE_FRONT && setFront) ||
			(type == rr::FACETYPE_BACK && setBack))
		{
			m_stencil[type].opStencilFail	= sfail;
			m_stencil[type].opDepthFail		= dpfail;
			m_stencil[type].opDepthPass		= dppass;
		}
	}
}